

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

JavascriptMethod Js::ScriptContext::GetProfileModeThunk(JavascriptMethod entryPoint)

{
  bool bVar1;
  BOOL BVar2;
  undefined4 *puVar3;
  code *pcVar4;
  
  BVar2 = IsIntermediateCodeGenThunk(entryPoint);
  if (BVar2 != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar1 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContext.cpp"
                                ,0x10c5,"(!IsIntermediateCodeGenThunk(entryPoint))",
                                "!IsIntermediateCodeGenThunk(entryPoint)");
    if (!bVar1) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar3 = 0;
  }
  pcVar4 = ProfileModeDeferredParsingThunk;
  if ((entryPoint != ProfileModeDeferredParsingThunk &&
       entryPoint != JavascriptFunction::DeferredParsingThunk) &&
     (pcVar4 = ProfileModeDeferredDeserializeThunk,
     entryPoint != ProfileModeDeferredDeserializeThunk &&
     entryPoint != JavascriptFunction::DeferredDeserializeThunk)) {
    bVar1 = CrossSite::IsThunk(entryPoint);
    if (bVar1) {
      pcVar4 = CrossSite::ProfileThunk;
    }
    else {
      pcVar4 = DebugProfileProbeThunk;
    }
  }
  return pcVar4;
}

Assistant:

JavascriptMethod ScriptContext::GetProfileModeThunk(JavascriptMethod entryPoint)
    {
    #if ENABLE_NATIVE_CODEGEN
        Assert(!IsIntermediateCodeGenThunk(entryPoint));
    #endif
        if (entryPoint == DefaultDeferredParsingThunk || entryPoint == ProfileDeferredParsingThunk)
        {
            return ProfileDeferredParsingThunk;
        }

        if (entryPoint == DefaultDeferredDeserializeThunk || entryPoint == ProfileDeferredDeserializeThunk)
        {
            return ProfileDeferredDeserializeThunk;
        }

        if (CrossSite::IsThunk(entryPoint))
        {
            return CrossSite::ProfileThunk;
        }
        return ProfileEntryThunk;
    }